

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O1

void __thiscall LayoutFile::LayoutFile(LayoutFile *this,uint8_t *f)

{
  (this->widgets).super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->widgets).super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->types).super__Vector_base<LayoutType,_std::allocator<LayoutType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->widgets).super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->types).super__Vector_base<LayoutType,_std::allocator<LayoutType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->types).super__Vector_base<LayoutType,_std::allocator<LayoutType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  this->root = (Widget *)0x0;
  if (f != (uint8_t *)0x0) {
    loadTypes(this,f + 0xc,*(uint *)(f + 8));
  }
  return;
}

Assistant:

uint8_t* BusyIndicator::read(uint8_t* buf)
{
	buf += Util::readBool(buf, animating);
	buf = Widget::read(buf);
	return buf;
}